

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult access_tvm_trvm(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint uVar2;
  uint64_t uVar3;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if ((uVar2 < 0x1b) && ((0x4410000U >> uVar2 & 1) != 0)) {
        return CP_ACCESS_OK;
      }
      if ((uVar1 >> 0x21 & 1) != 0) {
        if (uVar2 == 0x16) {
          if (((uint)uVar1 >> 0x1c & 1) == 0) {
            return CP_ACCESS_OK;
          }
        }
        else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
          return CP_ACCESS_OK;
        }
      }
      goto LAB_00612a64;
    }
    uVar2 = env->pstate >> 2 & 3;
  }
  else {
    if ((env->v7m).exception != 0) goto LAB_00612a64;
    uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
  }
  if (uVar2 != 1) {
    return CP_ACCESS_OK;
  }
LAB_00612a64:
  uVar3 = arm_hcr_el2_eff_aarch64(env);
  uVar2 = 0x4000000;
  if (isread) {
    uVar2 = 0x40000000;
  }
  if (((uint)uVar3 & uVar2) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL2;
}

Assistant:

static CPAccessResult access_tvm_trvm(CPUARMState *env, const ARMCPRegInfo *ri,
                                      bool isread)
{
    if (arm_current_el(env) == 1) {
        uint64_t trap = isread ? HCR_TRVM : HCR_TVM;
        if (arm_hcr_el2_eff(env) & trap) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}